

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall google::protobuf::internal::DynamicMapField::~DynamicMapField(DynamicMapField *this)

{
  bool bVar1;
  pointer pvVar2;
  iterator local_40;
  undefined1 local_28 [8];
  iterator iter;
  DynamicMapField *this_local;
  
  (this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
  super_MapFieldBase._vptr_MapFieldBase = (_func_int **)&PTR__DynamicMapField_00d61fe0;
  iter.it_.bucket_index_ = (size_type)this;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::begin
            ((iterator *)local_28,&this->map_);
  while( true ) {
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::end(&local_40,&this->map_);
    bVar1 = protobuf::operator!=((iterator *)local_28,&local_40);
    if (!bVar1) break;
    pvVar2 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::iterator::operator->
                       ((iterator *)local_28);
    MapValueRef::DeleteData(&pvVar2->second);
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::iterator::operator++
              ((iterator *)local_28);
  }
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::clear(&this->map_);
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::~Map(&this->map_);
  TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>::
  ~TypeDefinedMapFieldBase
            (&this->
              super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
            );
  return;
}

Assistant:

DynamicMapField::~DynamicMapField() {
  // DynamicMapField owns map values. Need to delete them before clearing
  // the map.
  for (Map<MapKey, MapValueRef>::iterator iter = map_.begin();
       iter != map_.end(); ++iter) {
    iter->second.DeleteData();
  }
  map_.clear();
}